

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

void __thiscall
eggs::variants::detail::
_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
::_storage(_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
           *this,_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
                 *rhs)

{
  visitor<eggs::variants::detail::copy_construct,void(void*,void_const*)> local_21;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
  *local_20;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
  *local_18;
  
  (this->
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_true,_true>
  )._which = 0;
  local_20 = rhs;
  local_18 = this;
  visitor<eggs::variants::detail::copy_construct,void(void*,void_const*)>::operator()
            (&local_21,
             (rhs->
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_true,_true>
             )._which);
  (this->
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_true,_true>
  )._which = (rhs->
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_true,_true>
             )._which;
  return;
}

Assistant:

EGGS_CXX11_NOEXCEPT_IF(all_of<pack<
                std::is_nothrow_copy_constructible<Ts>...
            >>::value)
#endif
          : base_type{}
        {
            detail::copy_construct{}(
                pack<Ts...>{}, rhs._which
              , target(), rhs.target()
            );
            _which = rhs._which;
        }